

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  jpeg_entropy_decoder *pjVar3;
  JBLOCKROW paJVar4;
  d_derived_tbl *htbl;
  jpeg_source_mgr *pjVar5;
  boolean bVar6;
  uint nbits;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int bits_left;
  long lVar10;
  _func_void_j_decompress_ptr *get_buffer;
  uint uVar11;
  boolean local_8c;
  savable_state state;
  bitread_working_state br_state;
  
  pjVar3 = cinfo->entropy;
  iVar1 = cinfo->Al;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar3[3].decode_mcu != 0)) ||
     (bVar6 = process_restart(cinfo), bVar6 != 0)) {
    if (*(int *)((long)&pjVar3[3].start_pass + 4) == 0) {
      br_state.cinfo = cinfo;
      br_state.next_input_byte = cinfo->src->next_input_byte;
      br_state.bytes_in_buffer = cinfo->src->bytes_in_buffer;
      get_buffer = pjVar3[1].start_pass;
      bits_left = *(int *)&pjVar3[1].decode_mcu;
      state.last_dc_val[3] = *(int *)&pjVar3[3].start_pass;
      state._0_8_ = pjVar3[2].start_pass;
      state.last_dc_val._4_8_ = pjVar3[2].decode_mcu;
      for (lVar10 = 0; lVar10 < cinfo->blocks_in_MCU; lVar10 = lVar10 + 1) {
        paJVar4 = MCU_data[lVar10];
        iVar2 = cinfo->MCU_membership[lVar10];
        htbl = (d_derived_tbl *)(&pjVar3[4].start_pass)[cinfo->cur_comp_info[iVar2]->dc_tbl_no];
        if (bits_left < 8) {
          bVar6 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,0);
          if (bVar6 == 0) {
            return 0;
          }
          iVar8 = 1;
          get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
          bits_left = br_state.bits_left;
          if (7 < br_state.bits_left) goto LAB_0023e635;
LAB_0023e660:
          nbits = jpeg_huff_decode(&br_state,(bit_buf_type)get_buffer,bits_left,htbl,iVar8);
          get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
          bits_left = br_state.bits_left;
          if ((int)nbits < 0) goto LAB_0023e6f5;
        }
        else {
LAB_0023e635:
          uVar9 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
          if (htbl->look_nbits[uVar9] == 0) {
            iVar8 = 9;
            goto LAB_0023e660;
          }
          nbits = (uint)htbl->look_sym[uVar9];
          bits_left = bits_left - htbl->look_nbits[uVar9];
        }
        if (nbits == 0) {
          iVar8 = 0;
        }
        else {
          if ((bits_left < (int)nbits) &&
             (bVar6 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,nbits),
             get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
             bits_left = br_state.bits_left, bVar6 == 0)) goto LAB_0023e6f5;
          bits_left = bits_left - nbits;
          uVar7 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[nbits];
          uVar11 = 0;
          if ((int)uVar7 <= bmask[nbits - 1]) {
            uVar11 = bmask[nbits];
          }
          iVar8 = uVar7 - uVar11;
        }
        iVar8 = iVar8 + state.last_dc_val[iVar2];
        state.last_dc_val[iVar2] = iVar8;
        (*paJVar4)[0] = (JCOEF)(iVar8 << ((byte)iVar1 & 0x1f));
      }
      pjVar5 = cinfo->src;
      pjVar5->next_input_byte = br_state.next_input_byte;
      pjVar5->bytes_in_buffer = br_state.bytes_in_buffer;
      pjVar3[1].start_pass = get_buffer;
      *(int *)&pjVar3[1].decode_mcu = bits_left;
      *(int *)&pjVar3[3].start_pass = state.last_dc_val[3];
      pjVar3[2].start_pass = (_func_void_j_decompress_ptr *)state._0_8_;
      pjVar3[2].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)state.last_dc_val._4_8_
      ;
    }
    local_8c = 1;
    *(int *)&pjVar3[3].decode_mcu = *(int *)&pjVar3[3].decode_mcu + -1;
  }
  else {
LAB_0023e6f5:
    local_8c = 0;
  }
  return local_8c;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    /* Scale and output the DC coefficient (assumes jpeg_natural_order[0]=0) */
    (*block)[0] = (JCOEF) (entropy->last_dc_val[ci] << cinfo->Al);
  }

  return TRUE;
}